

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O0

pair<__gnu_cxx::__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_bool>
 pdqsort_detail::
 partition_right<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,HighsPrimalHeuristics::RENS(std::vector<double,std::allocator<double>>const&)::__1>
           (__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
            begin,__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                  end,anon_class_16_2_405d1b53 comp)

{
  bool bVar1;
  reference ppVar2;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  *p_Var3;
  reference ppVar4;
  anon_class_16_2_405d1b53 *in_RDX;
  pair<int,_double> *in_RSI;
  pair<int,_double> *in_RDI;
  pair<__gnu_cxx::__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_bool>
  pVar5;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  pivot_pos;
  bool already_partitioned;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  last;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  first;
  T pivot;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  in_stack_ffffffffffffff58;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  in_stack_ffffffffffffff60;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  *in_stack_ffffffffffffff68;
  byte local_89;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  local_78;
  pair<int,_double> *local_70;
  pair<int,_double> *local_68;
  undefined1 local_59;
  pair<int,_double> *local_58;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  local_50;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  local_48;
  pair<int,_double> *b;
  pair<int,_double> *a;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  local_18 [3];
  
  local_18[0]._M_current = in_RDI;
  ppVar2 = __gnu_cxx::
           __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
           ::operator*(local_18);
  b = *(pair<int,_double> **)ppVar2;
  a = (pair<int,_double> *)ppVar2->second;
  local_48._M_current = local_18[0]._M_current;
  local_50._M_current = in_RSI;
  do {
    p_Var3 = __gnu_cxx::
             __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
             ::operator++(&local_48);
    __gnu_cxx::
    __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
    ::operator*(p_Var3);
    bVar1 = HighsPrimalHeuristics::RENS::anon_class_16_2_405d1b53::operator()(in_RDX,a,b);
  } while (bVar1);
  local_58 = (pair<int,_double> *)
             __gnu_cxx::
             __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
             ::operator-(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60._M_current);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                      *)in_stack_ffffffffffffff60._M_current,
                     (__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                      *)in_stack_ffffffffffffff58._M_current);
  if (bVar1) {
    do {
      bVar1 = __gnu_cxx::operator<
                        ((__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                          *)in_stack_ffffffffffffff60._M_current,
                         (__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                          *)in_stack_ffffffffffffff58._M_current);
      local_89 = 0;
      if (bVar1) {
        p_Var3 = __gnu_cxx::
                 __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                 ::operator--(&local_50);
        __gnu_cxx::
        __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
        ::operator*(p_Var3);
        bVar1 = HighsPrimalHeuristics::RENS::anon_class_16_2_405d1b53::operator()(in_RDX,a,b);
        local_89 = bVar1 ^ 0xff;
      }
    } while ((local_89 & 1) != 0);
  }
  else {
    do {
      p_Var3 = __gnu_cxx::
               __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
               ::operator--(&local_50);
      __gnu_cxx::
      __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
      ::operator*(p_Var3);
      bVar1 = HighsPrimalHeuristics::RENS::anon_class_16_2_405d1b53::operator()(in_RDX,a,b);
    } while (((bVar1 ^ 0xffU) & 1) != 0);
  }
  local_59 = __gnu_cxx::operator>=
                       ((__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                         *)in_stack_ffffffffffffff60._M_current,
                        (__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                         *)in_stack_ffffffffffffff58._M_current);
  while (bVar1 = __gnu_cxx::operator<
                           ((__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                             *)in_stack_ffffffffffffff60._M_current,
                            (__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                             *)in_stack_ffffffffffffff58._M_current), bVar1) {
    local_68 = local_48._M_current;
    local_70 = local_50._M_current;
    std::
    iter_swap<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    do {
      p_Var3 = __gnu_cxx::
               __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
               ::operator++(&local_48);
      __gnu_cxx::
      __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
      ::operator*(p_Var3);
      bVar1 = HighsPrimalHeuristics::RENS::anon_class_16_2_405d1b53::operator()(in_RDX,a,b);
    } while (bVar1);
    do {
      p_Var3 = __gnu_cxx::
               __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
               ::operator--(&local_50);
      __gnu_cxx::
      __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
      ::operator*(p_Var3);
      bVar1 = HighsPrimalHeuristics::RENS::anon_class_16_2_405d1b53::operator()(in_RDX,a,b);
    } while (((bVar1 ^ 0xffU) & 1) != 0);
  }
  local_78 = __gnu_cxx::
             __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
             ::operator-(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60._M_current);
  p_Var3 = &local_78;
  ppVar2 = __gnu_cxx::
           __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
           ::operator*(p_Var3);
  ppVar4 = __gnu_cxx::
           __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
           ::operator*(local_18);
  std::pair<int,_double>::operator=(ppVar4,ppVar2);
  ppVar4 = __gnu_cxx::
           __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
           ::operator*(p_Var3);
  std::pair<int,_double>::operator=(ppVar4,(type)&stack0xffffffffffffffc0);
  pVar5 = std::
          make_pair<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>&,bool&>
                    ((__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                      *)ppVar2,(bool *)in_stack_ffffffffffffff58._M_current);
  return pVar5;
}

Assistant:

inline std::pair<Iter, bool> partition_right(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        
        // Move pivot into local for speed.
        T pivot(PDQSORT_PREFER_MOVE(*begin));

        Iter first = begin;
        Iter last = end;

        // Find the first element greater than or equal than the pivot (the median of 3 guarantees
        // this exists).
        while (comp(*++first, pivot));

        // Find the first element strictly smaller than the pivot. We have to guard this search if
        // there was no element before *first.
        if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
        else                    while (                !comp(*--last, pivot));

        // If the first pair of elements that should be swapped to partition are the same element,
        // the passed in sequence already was correctly partitioned.
        bool already_partitioned = first >= last;
        
        // Keep swapping pairs of elements that are on the wrong side of the pivot. Previously
        // swapped pairs guard the searches, which is why the first iteration is special-cased
        // above.
        while (first < last) {
            std::iter_swap(first, last);
            while (comp(*++first, pivot));
            while (!comp(*--last, pivot));
        }

        // Put the pivot in the right place.
        Iter pivot_pos = first - 1;
        *begin = PDQSORT_PREFER_MOVE(*pivot_pos);
        *pivot_pos = PDQSORT_PREFER_MOVE(pivot);

        return std::make_pair(pivot_pos, already_partitioned);
    }